

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

string_view slang::ast::SemanticFacts::getCaseConditionStr(CaseStatementCondition kind)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  
  if (kind == WildcardXOrZ) {
    sVar2._M_str = "casex";
    sVar2._M_len = 5;
    return sVar2;
  }
  if (kind == WildcardJustZ) {
    sVar1._M_str = "casez";
    sVar1._M_len = 5;
    return sVar1;
  }
  sVar3._M_str = "case";
  sVar3._M_len = 4;
  return sVar3;
}

Assistant:

std::string_view SemanticFacts::getCaseConditionStr(CaseStatementCondition kind) {
    switch (kind) {
        case CaseStatementCondition::WildcardXOrZ:
            return "casex"sv;
        case CaseStatementCondition::WildcardJustZ:
            return "casez"sv;
        default:
            return "case"sv;
    }
}